

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::destroy(Player *this)

{
  long in_RDI;
  
  al_destroy_bitmap(*(undefined8 *)(in_RDI + 0x60));
  al_destroy_bitmap(*(undefined8 *)(in_RDI + 0x68));
  al_destroy_bitmap(*(undefined8 *)(in_RDI + 0x70));
  al_destroy_bitmap(*(undefined8 *)(in_RDI + 0x78));
  al_destroy_bitmap(*(undefined8 *)(in_RDI + 0x80));
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  return;
}

Assistant:

void Player::destroy(void)
{
   al_destroy_bitmap(bitmap);
   al_destroy_bitmap(trans_bitmap);
   al_destroy_bitmap(trail_bitmap);
   al_destroy_bitmap(icon);
   al_destroy_bitmap(highscoreBitmap);
   bitmap = 0;
   trans_bitmap = 0;
   trail_bitmap = 0;
   icon = 0;
   highscoreBitmap = 0;
}